

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

VoidPromiseAndPipeline * __thiscall
capnp::anon_unknown_0::MembraneHook::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,MembraneHook *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  bool bVar2;
  ClientHook *pCVar3;
  MembranePolicy *pMVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 *puVar8;
  _func_int ***ppp_Var9;
  _func_int ***ppp_Var10;
  undefined8 uVar11;
  PromiseNode *pPVar12;
  long *plVar13;
  MembraneHook *pMVar14;
  Disposer *pDVar15;
  PipelineHook *pPVar16;
  byte bVar17;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar18;
  Maybe<capnp::Capability::Client> redirect;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_e8;
  undefined1 local_c8 [12];
  undefined4 uStack_bc;
  PromiseNode *local_b8;
  _func_int **pp_Stack_b0;
  Promise<kj::Own<capnp::ClientHook>_> local_a8;
  PromiseNode *pPStack_98;
  VoidPromiseAndPipeline *local_88;
  char local_80 [8];
  undefined8 *local_78;
  long *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  PromiseNode *pPStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  PromiseNode *pPStack_50;
  Refcounted *local_40;
  MembraneHook *local_38;
  
  pCVar3 = (this->resolved).ptr.ptr;
  if (pCVar3 == (ClientHook *)0x0) {
    pMVar4 = (this->policy).ptr;
    local_88 = __return_storage_ptr__;
    if (this->reverse == true) {
      (*((this->inner).ptr)->_vptr_ClientHook[4])(local_c8);
      local_58 = local_c8._0_4_;
      uStack_54 = local_c8._4_4_;
      pPStack_50 = (PromiseNode *)stack0xffffffffffffff40;
      stack0xffffffffffffff40 = (Disposer *)0x0;
      (*pMVar4->_vptr_MembranePolicy[1])(local_80,pMVar4,interfaceId,methodId);
      pPVar12 = pPStack_50;
      __return_storage_ptr__ = local_88;
      if (pPStack_50 != (PromiseNode *)0x0) {
        pPStack_50 = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_54,local_58))
                  ((undefined8 *)CONCAT44(uStack_54,local_58),
                   (_func_int *)
                   ((long)&pPVar12->_vptr_PromiseNode + (long)pPVar12->_vptr_PromiseNode[-2]));
      }
      pDVar15 = stack0xffffffffffffff40;
      if (stack0xffffffffffffff40 != (Disposer *)0x0) {
        stack0xffffffffffffff40 = (Disposer *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_c8._4_4_,local_c8._0_4_))
                  ((undefined8 *)CONCAT44(local_c8._4_4_,local_c8._0_4_),
                   (_func_int *)((long)&pDVar15->_vptr_Disposer + (long)pDVar15->_vptr_Disposer[-2])
                  );
      }
    }
    else {
      (*((this->inner).ptr)->_vptr_ClientHook[4])(local_c8);
      local_68 = local_c8._0_4_;
      uStack_64 = local_c8._4_4_;
      pPStack_60 = (PromiseNode *)stack0xffffffffffffff40;
      stack0xffffffffffffff40 = (Disposer *)0x0;
      (**pMVar4->_vptr_MembranePolicy)(local_80,pMVar4,interfaceId,methodId);
      pPVar12 = pPStack_60;
      if (pPStack_60 != (PromiseNode *)0x0) {
        pPStack_60 = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_64,local_68))
                  ((undefined8 *)CONCAT44(uStack_64,local_68),
                   (_func_int *)
                   ((long)&pPVar12->_vptr_PromiseNode + (long)pPVar12->_vptr_PromiseNode[-2]));
      }
      pDVar15 = stack0xffffffffffffff40;
      __return_storage_ptr__ = local_88;
      if (stack0xffffffffffffff40 != (Disposer *)0x0) {
        stack0xffffffffffffff40 = (Disposer *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_c8._4_4_,local_c8._0_4_))
                  ((undefined8 *)CONCAT44(local_c8._4_4_,local_c8._0_4_),
                   (_func_int *)((long)&pDVar15->_vptr_Disposer + (long)pDVar15->_vptr_Disposer[-2])
                  );
        __return_storage_ptr__ = local_88;
      }
    }
    if (local_80[0] == '\x01') {
      whenMoreResolved((Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)&local_e8,this);
      bVar2 = local_e8.isSet;
      local_c8[0] = local_e8.isSet;
      if ((capnp)local_e8.isSet == (capnp)0x0) {
        bVar17 = 0;
      }
      else {
        stack0xffffffffffffff40 = local_e8.field_1.value.super_PromiseBase.node.disposer;
        local_b8 = local_e8.field_1.value.super_PromiseBase.node.ptr;
        puVar1 = &(this->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        local_40 = &this->super_Refcounted;
        local_38 = this;
        kj::Promise<kj::Own<capnp::ClientHook>>::attach<kj::Own<capnp::ClientHook>>
                  ((Promise<kj::Own<capnp::ClientHook>> *)&local_a8,
                   (Own<capnp::ClientHook> *)(local_c8 + 8));
        newLocalPromiseClient((capnp *)&local_e8,&local_a8);
        (*(local_e8.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer[1])
                  (__return_storage_ptr__,local_e8.field_1.value.super_PromiseBase.node.disposer,
                   interfaceId,methodId,context);
        uVar11 = local_e8.field_1.value.super_PromiseBase.node.disposer;
        if (local_e8.field_1.value.super_PromiseBase.node.disposer != (Disposer *)0x0) {
          local_e8.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
          (*(code *)**(undefined8 **)local_e8._0_8_)
                    (local_e8._0_8_,
                     (_func_int *)
                     ((long)&((Disposer *)uVar11)->_vptr_Disposer +
                     (long)((Disposer *)uVar11)->_vptr_Disposer[-2]));
        }
        pPVar12 = local_a8.super_PromiseBase.node.ptr;
        if ((Disposer *)local_a8.super_PromiseBase.node.ptr != (Disposer *)0x0) {
          local_a8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                               local_a8.super_PromiseBase.node.disposer._0_4_))
                    ((undefined8 *)
                     CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                              local_a8.super_PromiseBase.node.disposer._0_4_),
                     (_func_int *)
                     ((long)&pPVar12->_vptr_PromiseNode + (long)pPVar12->_vptr_PromiseNode[-2]));
        }
        pMVar14 = local_38;
        if (local_38 != (MembraneHook *)0x0) {
          local_38 = (MembraneHook *)0x0;
          (**(local_40->super_Disposer)._vptr_Disposer)
                    (local_40,(_func_int *)
                              ((long)&(pMVar14->super_ClientHook)._vptr_ClientHook +
                              (long)(pMVar14->super_ClientHook)._vptr_ClientHook[-2]));
        }
        bVar17 = local_c8[0];
      }
      pPVar12 = local_b8;
      if (((bVar17 & 1) != 0) && (local_b8 != (PromiseNode *)0x0)) {
        local_b8 = (PromiseNode *)0x0;
        (**stack0xffffffffffffff40->_vptr_Disposer)
                  (stack0xffffffffffffff40,
                   (_func_int *)
                   ((long)&pPVar12->_vptr_PromiseNode + (long)pPVar12->_vptr_PromiseNode[-2]));
      }
      plVar13 = local_70;
      puVar8 = local_78;
      if ((capnp)bVar2 == (capnp)0x0) {
        local_70 = (long *)0x0;
        (**(code **)(*plVar13 + 8))(__return_storage_ptr__,plVar13,interfaceId,methodId,context);
        (**(code **)*puVar8)(puVar8,(long)plVar13 + *(long *)(*plVar13 + -0x10));
        __return_storage_ptr__ = local_88;
      }
    }
    else {
      pCVar3 = (this->inner).ptr;
      (*((this->policy).ptr)->_vptr_MembranePolicy[2])(&local_a8);
      bVar2 = this->reverse;
      local_e8.field_1.value.super_PromiseBase.node.disposer = (Disposer *)operator_new(0xd0);
      pPVar12 = local_a8.super_PromiseBase.node.ptr;
      bVar17 = bVar2 ^ 1;
      local_e8._0_8_ = (long)local_e8.field_1.value.super_PromiseBase.node.disposer + 8;
      (local_e8.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer =
           (_func_int **)&PTR_getParams_0061fb90;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 8))->
      _vptr_Disposer = (_func_int **)&PTR_disposeImpl_0061fbf0;
      uVar5 = *(undefined4 *)((long)&context->disposer + 4);
      uVar6 = *(undefined4 *)&context->ptr;
      uVar7 = *(undefined4 *)((long)&context->ptr + 4);
      *(undefined4 *)
       &((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x18))->
        _vptr_Disposer = *(undefined4 *)&context->disposer;
      *(undefined4 *)
       ((long)&((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x18))->
               _vptr_Disposer + 4) = uVar5;
      *(undefined4 *)
       &((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x20))->
        _vptr_Disposer = uVar6;
      *(undefined4 *)
       ((long)&((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x20))->
               _vptr_Disposer + 4) = uVar7;
      context->ptr = (CallContextHook *)0x0;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x28))->
      _vptr_Disposer =
           (_func_int **)
           CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                    local_a8.super_PromiseBase.node.disposer._0_4_);
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x30))->
      _vptr_Disposer = (_func_int **)local_a8.super_PromiseBase.node.ptr;
      local_a8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      *(byte *)&((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x38))
                ->_vptr_Disposer = bVar17;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x40))->
      _vptr_Disposer = (_func_int **)&PTR_extractCap_0061f758;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x48))->
      _vptr_Disposer = (_func_int **)0x0;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x50))->
      _vptr_Disposer = (_func_int **)pPVar12;
      *(byte *)&((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x58))
                ->_vptr_Disposer = bVar17;
      *(undefined1 *)
       &((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x60))->
        _vptr_Disposer = 0;
      *(undefined1 *)
       &((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x88))->
        _vptr_Disposer = 0;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x90))->
      _vptr_Disposer = (_func_int **)&PTR_extractCap_0061f900;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x98))->
      _vptr_Disposer = (_func_int **)0x0;
      ((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0xa0))->
      _vptr_Disposer = (_func_int **)pPVar12;
      *(byte *)&((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0xa8))
                ->_vptr_Disposer = bVar17;
      *(undefined1 *)
       &((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0xb0))->
        _vptr_Disposer = 0;
      *(undefined4 *)
       &((Disposer *)((long)local_e8.field_1.value.super_PromiseBase.node.disposer + 0x10))->
        _vptr_Disposer = 1;
      (*pCVar3->_vptr_ClientHook[1])(local_c8,pCVar3,interfaceId,methodId);
      uVar11 = local_e8.field_1.value.super_PromiseBase.node.disposer;
      if (local_e8.field_1.value.super_PromiseBase.node.disposer != (Disposer *)0x0) {
        local_e8.field_1.value.super_PromiseBase.node.disposer = (Disposer *)0x0;
        (***(_func_int ***)local_e8._0_8_)
                  (local_e8._0_8_,
                   (_func_int *)
                   ((long)&((Disposer *)uVar11)->_vptr_Disposer +
                   (long)((Disposer *)uVar11)->_vptr_Disposer[-2]));
      }
      pPVar12 = local_a8.super_PromiseBase.node.ptr;
      if ((Disposer *)local_a8.super_PromiseBase.node.ptr != (Disposer *)0x0) {
        local_a8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                             local_a8.super_PromiseBase.node.disposer._0_4_))
                  ((undefined8 *)
                   CONCAT44(local_a8.super_PromiseBase.node.disposer._4_4_,
                            local_a8.super_PromiseBase.node.disposer._0_4_),
                   (_func_int *)
                   ((long)&pPVar12->_vptr_PromiseNode + (long)pPVar12->_vptr_PromiseNode[-2]));
      }
      (*((this->policy).ptr)->_vptr_MembranePolicy[3])(&local_a8);
      __return_storage_ptr__ = local_88;
      local_e8.isSet = (bool)local_a8.super_PromiseBase.node.disposer._0_1_;
      pDVar15 = stack0xffffffffffffff40;
      if (local_a8.super_PromiseBase.node.disposer._0_1_ != (Promise<kj::Own<capnp::ClientHook>>)0x0
         ) {
        local_e8.field_1.value.super_PromiseBase.node.disposer =
             (Disposer *)local_a8.super_PromiseBase.node.ptr;
        local_e8.field_1.value.super_PromiseBase.node.ptr = pPStack_98;
        OVar18 = kj::
                 heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                           ((kj *)&local_a8,(Own<kj::_::PromiseNode> *)local_c8,
                            (Own<kj::_::PromiseNode> *)&local_e8.field_1.value);
        puVar8 = (undefined8 *)CONCAT44(local_c8._4_4_,local_c8._0_4_);
        local_c8._0_4_ = local_a8.super_PromiseBase.node.disposer._0_4_;
        local_c8._4_4_ = local_a8.super_PromiseBase.node.disposer._4_4_;
        pDVar15 = (Disposer *)local_a8.super_PromiseBase.node.ptr;
        if (stack0xffffffffffffff40 != (Disposer *)0x0) {
          ppp_Var9 = &stack0xffffffffffffff40->_vptr_Disposer;
          ppp_Var10 = &stack0xffffffffffffff40->_vptr_Disposer;
          unique0x10000ede = (Disposer *)local_a8.super_PromiseBase.node.ptr;
          (**(code **)*puVar8)
                    (puVar8,(_func_int *)((long)ppp_Var10 + (long)(*ppp_Var9)[-2]),OVar18.ptr);
          pDVar15 = stack0xffffffffffffff40;
        }
      }
      stack0xffffffffffffff40 = pDVar15;
      uVar11 = local_e8.field_1.value.super_PromiseBase.node.ptr;
      if (((capnp)local_e8.isSet == (capnp)0x1) &&
         (local_e8.field_1.value.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
        local_e8.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (**(local_e8.field_1.value.super_PromiseBase.node.disposer)->_vptr_Disposer)
                  (local_e8.field_1.value.super_PromiseBase.node.disposer,
                   (_func_int *)
                   ((long)&((PromiseNode *)uVar11)->_vptr_PromiseNode +
                   (long)((PromiseNode *)uVar11)->_vptr_PromiseNode[-2]));
      }
      *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
           local_c8._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.disposer + 4)
           = local_c8._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr = local_c8._8_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->promise).super_PromiseBase.node.ptr + 4) =
           uStack_bc;
      stack0xffffffffffffff40 = (Disposer *)0x0;
      (*((this->policy).ptr)->_vptr_MembranePolicy[2])(&local_e8);
      bVar2 = this->reverse;
      pPVar16 = (PipelineHook *)operator_new(0x40);
      pDVar15 = stack0xffffffffffffff40;
      pPVar16->_vptr_PipelineHook = (_func_int **)&PTR_addRef_0061f940;
      pPVar16[1]._vptr_PipelineHook = (_func_int **)&PTR_disposeImpl_0061f978;
      pPVar16[3]._vptr_PipelineHook = (_func_int **)local_b8;
      pPVar16[4]._vptr_PipelineHook = pp_Stack_b0;
      pp_Stack_b0 = (_func_int **)0x0;
      *(undefined4 *)&pPVar16[5]._vptr_PipelineHook = local_e8._0_4_;
      *(undefined4 *)((long)&pPVar16[5]._vptr_PipelineHook + 4) = local_e8._4_4_;
      *(undefined4 *)&pPVar16[6]._vptr_PipelineHook = local_e8.field_1._0_4_;
      *(undefined4 *)((long)&pPVar16[6]._vptr_PipelineHook + 4) = local_e8.field_1._4_4_;
      *(byte *)&pPVar16[7]._vptr_PipelineHook = bVar2 & 1;
      *(undefined4 *)&pPVar16[2]._vptr_PipelineHook = 1;
      (__return_storage_ptr__->pipeline).disposer = (Disposer *)(pPVar16 + 1);
      (__return_storage_ptr__->pipeline).ptr = pPVar16;
      if (stack0xffffffffffffff40 != (Disposer *)0x0) {
        stack0xffffffffffffff40 = (Disposer *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_c8._4_4_,local_c8._0_4_))
                  ((undefined8 *)CONCAT44(local_c8._4_4_,local_c8._0_4_),
                   (_func_int *)((long)&pDVar15->_vptr_Disposer + (long)pDVar15->_vptr_Disposer[-2])
                  );
      }
    }
    plVar13 = local_70;
    if ((local_80[0] == '\x01') && (local_70 != (long *)0x0)) {
      local_70 = (long *)0x0;
      (**(code **)*local_78)(local_78,(long)plVar13 + *(long *)(*plVar13 + -0x10));
    }
  }
  else {
    (*pCVar3->_vptr_ClientHook[1])(__return_storage_ptr__,pCVar3,interfaceId,methodId,context);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_MAYBE(r, resolved) {
      return r->get()->call(interfaceId, methodId, kj::mv(context));
    }